

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

expr_t * expr_new_op(int symbol,expr_t **children,int ver)

{
  operation_t *poVar1;
  expr_t *peVar2;
  expr_t **ppeVar3;
  expr_t *data;
  
  poVar1 = op_get(symbol,ver);
  if (poVar1 == (operation_t *)0x0) {
    peVar2 = (expr_t *)0x0;
  }
  else {
    peVar2 = (expr_t *)malloc(0x30);
    list_init(&peVar2->children);
    peVar2->param = (thanm_param_t *)0x0;
    peVar2->reg = (reg_t *)0x0;
    peVar2->type = EXPR_OP;
    peVar2->op = poVar1;
    data = *children;
    if (data != (expr_t *)0x0) {
      ppeVar3 = children + 1;
      do {
        list_append_new(&peVar2->children,data);
        data = *ppeVar3;
        ppeVar3 = ppeVar3 + 1;
      } while (data != (expr_t *)0x0);
    }
  }
  return peVar2;
}

Assistant:

expr_t*
expr_new_op(
    int symbol,
    expr_t* children[],
    int ver
) {
    const operation_t* op = op_get(symbol, ver);
    if (!op)
        return NULL;

    expr_t* ret = expr_new(EXPR_OP);
    ret->op = op;

    int ind = 0;
    while(children[ind]) {
        list_append_new(&ret->children, children[ind]);
        ++ind;
    }

    return ret;
}